

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan.hpp
# Opt level: O2

string * duckdb::ReplacementScan::GetFullPath
                   (string *__return_storage_ptr__,string *catalog,string *schema,string *table)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)catalog);
  if (schema->_M_string_length != 0) {
    pcVar1 = ".";
    if (__return_storage_ptr__->_M_string_length == 0) {
      pcVar1 = anon_var_dwarf_4b4b1b2 + 9;
    }
    ::std::operator+(&bStack_38,pcVar1,schema);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_38);
  }
  pcVar1 = ".";
  if (__return_storage_ptr__->_M_string_length == 0) {
    pcVar1 = anon_var_dwarf_4b4b1b2 + 9;
  }
  ::std::operator+(&bStack_38,pcVar1,table);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

static string GetFullPath(const string &catalog, const string &schema, const string &table) {
		string table_name = catalog;
		if (!schema.empty()) {
			table_name += (!table_name.empty() ? "." : "") + schema;
		}
		table_name += (!table_name.empty() ? "." : "") + table;
		return table_name;
	}